

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

bool __thiscall QStyleSheetStyle::hasStyleRule(QStyleSheetStyle *this,QObject *obj,int part)

{
  char *pcVar1;
  Span *pSVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  QStyleSheetStyle *this_00;
  uchar uVar7;
  QStyleSheetStyle *this_01;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QLatin1String QVar10;
  const_iterator cVar11;
  QArrayDataPointer<QCss::StyleRule> QStack_78;
  int local_5c;
  QObject *local_58;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = part;
  local_58 = obj;
  QHash<QObject_const*,QHash<int,bool>>::tryEmplace_impl<QObject_const*const&>
            (&local_50,(QHash<QObject_const*,QHash<int,bool>> *)&styleSheetCaches->hasStyleRuleCache
             ,&local_58);
  this_00 = (QStyleSheetStyle *)
            ((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
             [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
              [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 8);
  this_01 = this_00;
  cVar11 = QHash<int,_bool>::constFindImpl<int>((QHash<int,_bool> *)this_00,&local_5c);
  if (cVar11.i.d == (Data<QHashPrivate::Node<int,_bool>_> *)0x0 && cVar11.i.bucket == 0) {
    bVar3 = initObject(this_01,local_58);
    if (bVar3) {
      styleRules((QList<QCss::StyleRule> *)&QStack_78,this,local_58);
      lVar5 = (long)local_5c;
      if (lVar5 == 0) {
        uVar7 = local_58 != (QObject *)0x0 && QStack_78.size != 0;
        QHash<int,bool>::tryEmplace_impl<int_const&>
                  ((TryEmplaceResult *)&local_50,this_00,&local_5c);
        (((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries)->storage).data
        [(ulong)(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                [(uint)local_50.iterator.i.bucket & 0x7f] * 8 + 4] = uVar7;
      }
      else {
        lVar8 = -1;
        do {
          pcVar1 = (char *)(lVar5 * 0x18 + 0x66ff25 + lVar8);
          lVar8 = lVar8 + 1;
        } while (*pcVar1 != '\0');
        if (QStack_78.size != 0) {
          uVar6 = 0;
          do {
            QCss::Selector::pseudoElement();
            QVar9.m_data = (storage_type_conflict *)local_50.iterator.i.bucket;
            QVar9.m_size = local_50._16_8_;
            QVar10.m_data = knownPseudoElements[lVar5].name;
            QVar10.m_size = lVar8;
            iVar4 = QtPrivate::compareStrings(QVar10,QVar9,CaseInsensitive);
            if (local_50.iterator.i.d !=
                (Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> *)0x0) {
              LOCK();
              ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,2,0x10);
              }
            }
            if (iVar4 == 0) {
              QHash<int,bool>::tryEmplace_impl<int_const&>
                        ((TryEmplaceResult *)&local_50,this_00,&local_5c);
              (((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries)->storage).
              data[(ulong)(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                          [(uint)local_50.iterator.i.bucket & 0x7f] * 8 + 4] = '\x01';
              uVar7 = true;
              goto LAB_0035848c;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)QStack_78.size);
        }
        QHash<int,bool>::tryEmplace_impl<int_const&>
                  ((TryEmplaceResult *)&local_50,this_00,&local_5c);
        (((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries)->storage).data
        [(ulong)(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                [(uint)local_50.iterator.i.bucket & 0x7f] * 8 + 4] = '\0';
        uVar7 = false;
      }
LAB_0035848c:
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&QStack_78);
    }
    else {
      uVar7 = '\0';
    }
  }
  else {
    pSVar2 = (cVar11.i.d)->spans;
    uVar6 = cVar11.i.bucket >> 7;
    uVar7 = pSVar2[uVar6].entries[pSVar2[uVar6].offsets[(uint)cVar11.i.bucket & 0x7f]].storage.data
            [4];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::hasStyleRule(const QObject *obj, int part) const
{
    QHash<int, bool> &cache = styleSheetCaches->hasStyleRuleCache[obj];
    QHash<int, bool>::const_iterator cacheIt = cache.constFind(part);
    if (cacheIt != cache.constEnd())
        return cacheIt.value();

    if (!initObject(obj))
        return false;

    const QList<StyleRule> &rules = styleRules(obj);
    if (part == PseudoElement_None) {
        bool result = obj && !rules.isEmpty();
        cache[part] = result;
        return result;
    }

    auto pseudoElement = QLatin1StringView(knownPseudoElements[part].name);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        if (pseudoElement.compare(selector.pseudoElement(), Qt::CaseInsensitive) == 0) {
            cache[part] = true;
            return true;
        }
    }

    cache[part] = false;
    return false;
}